

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_rcu_list.h
# Opt level: O3

void __thiscall
libguarded::
rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::
rcu_guard::unlock(rcu_guard *this)

{
  __pointer_type pzVar1;
  __pointer_type pzVar2;
  
  pzVar2 = (this->m_zombie->next)._M_b._M_p;
  pzVar1 = pzVar2;
  if (pzVar2 != (__pointer_type)0x0) {
    do {
      if ((pzVar1->owner)._M_b._M_p != (__pointer_type)0x0) goto LAB_0010514c;
      pzVar1 = (pzVar1->next)._M_b._M_p;
    } while (pzVar1 != (__pointer_type)0x0);
    do {
      if (pzVar2->zombie_node != (node *)0x0) {
        operator_delete(pzVar2->zombie_node,0x20);
      }
      pzVar1 = (pzVar2->next)._M_b._M_p;
      operator_delete(pzVar2,0x18);
      pzVar2 = pzVar1;
    } while (pzVar1 != (__pointer_type)0x0);
  }
  LOCK();
  (this->m_zombie->next)._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
LAB_0010514c:
  LOCK();
  (this->m_zombie->owner)._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  return;
}

Assistant:

void rcu_list<T, M, Alloc>::rcu_guard::unlock()
{
   zombie_list_node *cached_next = m_zombie->next.load();
   zombie_list_node *n           = cached_next;

   bool last = true;

   while (n) {
      if (n->owner.load() != nullptr) {
         last = false;
         break;
      }

      n = n->next.load();
   }

   n = cached_next;

   if (last) {
      while (n) {
         node *deadNode = n->zombie_node;

         if (deadNode != nullptr) {
            node_alloc_trait::destroy(m_list->m_node_alloc, deadNode);
            node_alloc_trait::deallocate(m_list->m_node_alloc, deadNode, 1);
         }

         zombie_list_node *oldnode = n;
         n = n->next.load();

         if (oldnode != nullptr) {
            zombie_alloc_trait::destroy(m_list->m_zombie_alloc, oldnode);
            zombie_alloc_trait::deallocate(m_list->m_zombie_alloc, oldnode, 1);
         }
      }

      m_zombie->next.store(n);
   }

   m_zombie->owner.store(nullptr);
}